

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O3

bool __thiscall
S2MinDistancePointTarget::UpdateMinDistance
          (S2MinDistancePointTarget *this,S2Point *p,S2MinDistance *min_dist)

{
  double dVar1;
  undefined1 in_AL;
  undefined7 in_register_00000001;
  S1ChordAngle local_18;
  
  local_18.length2_ = (double)CONCAT71(in_register_00000001,in_AL);
  S1ChordAngle::S1ChordAngle(&local_18,p,&this->point_);
  dVar1 = (min_dist->super_S1ChordAngle).length2_;
  if (local_18.length2_ < dVar1) {
    (min_dist->super_S1ChordAngle).length2_ = local_18.length2_;
  }
  return local_18.length2_ < dVar1;
}

Assistant:

bool S2MinDistancePointTarget::UpdateMinDistance(
    const S2Point& p, S2MinDistance* min_dist) {
  return min_dist->UpdateMin(S2MinDistance(S1ChordAngle(p, point_)));
}